

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict initializer_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  node_t pnVar1;
  bool bVar2;
  node_t_conflict n;
  c2m_ctx_t pcVar3;
  int iVar4;
  char *pcVar5;
  node_t_conflict op;
  code *pcVar6;
  node_t_conflict pnStack_40;
  int first_p;
  node_t_conflict r;
  node_t_conflict list2;
  node_t_conflict list;
  parse_ctx_t parse_ctx;
  c2m_ctx_t pcStack_18;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  list = (node_t_conflict)c2m_ctx->parse_ctx;
  parse_ctx._4_4_ = no_err_p;
  pcStack_18 = c2m_ctx;
  list2 = new_node(c2m_ctx,N_LIST);
  if ((short)((list->op_link).prev)->code == 0x7d) {
    pcVar6 = warning;
    if (pcStack_18->options->pedantic_p != 0) {
      pcVar6 = error;
    }
    pnVar1 = (list->op_link).prev;
    (*pcVar6)(pcStack_18,pnVar1->attr,(pnVar1->op_link).prev,"empty initializer list");
    return list2;
  }
LAB_001a3964:
  r = new_node(pcStack_18,N_LIST);
  bVar2 = true;
  do {
    iVar4 = match(pcStack_18,0x5b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar4 == 0) {
      iVar4 = match(pcStack_18,0x2e,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar4 == 0) break;
      iVar4 = match(pcStack_18,0x103,(pos_t *)0x0,(node_code_t *)0x0,&stack0xffffffffffffffc0);
      pcVar3 = pcStack_18;
      if (iVar4 == 0) {
        if (list->code == N_IGNORE) {
          pcVar5 = get_token_name(pcStack_18,0x103);
          syntax_error(pcVar3,pcVar5);
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
        return (node_t_conflict)c2m_ctx_local;
      }
      pnStack_40 = new_node1(pcStack_18,N_FIELD_ID,pnStack_40);
    }
    else {
      pnStack_40 = cond_expr(pcStack_18,parse_ctx._4_4_);
      if (pnStack_40 == &err_struct) {
        return &err_struct;
      }
      iVar4 = match(pcStack_18,0x5d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      pcVar3 = pcStack_18;
      if (iVar4 == 0) {
        if (list->code == N_IGNORE) {
          pcVar5 = get_token_name(pcStack_18,0x5d);
          syntax_error(pcVar3,pcVar5);
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
        return (node_t_conflict)c2m_ctx_local;
      }
    }
    op_append(pcStack_18,r,pnStack_40);
    bVar2 = false;
  } while( true );
  if ((!bVar2) &&
     (iVar4 = match(pcStack_18,0x3d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0),
     pcVar3 = pcStack_18, iVar4 == 0)) {
    if (list->code == N_IGNORE) {
      pcVar5 = get_token_name(pcStack_18,0x3d);
      syntax_error(pcVar3,pcVar5);
    }
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
    return (node_t_conflict)c2m_ctx_local;
  }
  pnStack_40 = initializer(pcStack_18,parse_ctx._4_4_);
  pcVar3 = pcStack_18;
  n = list2;
  if (pnStack_40 == &err_struct) {
    return &err_struct;
  }
  op = new_node2(pcStack_18,N_INIT,r,pnStack_40);
  op_append(pcVar3,n,op);
  iVar4 = match(pcStack_18,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if ((iVar4 == 0) || ((short)((list->op_link).prev)->code == 0x7d)) {
    return list2;
  }
  goto LAB_001a3964;
}

Assistant:

D (initializer_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, list2, r;
  int first_p;

  list = new_node (c2m_ctx, N_LIST);
  if (C ('}')) {
    (c2m_options->pedantic_p ? error : warning) (c2m_ctx, curr_token->pos,
                                                 "empty initializer list");
    return list;
  }
  for (;;) { /* designation */
    list2 = new_node (c2m_ctx, N_LIST);
    for (first_p = TRUE;; first_p = FALSE) { /* designator-list, designator */
      if (M ('[')) {
        P (const_expr);
        PT (']');
      } else if (M ('.')) {
        PTN (T_ID);
        r = new_node1 (c2m_ctx, N_FIELD_ID, r);
      } else
        break;
      op_append (c2m_ctx, list2, r);
    }
    if (!first_p) {
      PT ('=');
    }
    P (initializer);
    op_append (c2m_ctx, list, new_node2 (c2m_ctx, N_INIT, list2, r));
    if (!M (',')) break;
    if (C ('}')) break;
  }
  return list;
}